

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_connect(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  int local_40;
  int local_3c;
  int real_path_len;
  int fd;
  FILEPROTO *file;
  char *real_path;
  SessionHandle *data;
  _Bool *done_local;
  connectdata *conn_local;
  
  real_path = (char *)conn->data;
  _real_path_len = (undefined8 *)(((SessionHandle *)real_path)->req).protop;
  data = (SessionHandle *)done;
  done_local = (_Bool *)conn;
  file = (FILEPROTO *)
         curl_easy_unescape(real_path,(((SessionHandle *)real_path)->state).path,0,&local_40);
  if (file == (FILEPROTO *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pvVar1 = memchr(file,0,(long)local_40);
    if (pvVar1 == (void *)0x0) {
      local_3c = open64((char *)file,0);
      *_real_path_len = file;
      _real_path_len[1] = file;
      *(int *)(_real_path_len + 2) = local_3c;
      if (((real_path[0x491] & 1U) == 0) && (local_3c == -1)) {
        Curl_failf((SessionHandle *)real_path,"Couldn\'t open file %s",
                   *(undefined8 *)(real_path + 0x8a38));
        file_done((connectdata *)done_local,CURLE_FILE_COULDNT_READ_FILE,false);
        conn_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
      }
      else {
        *(undefined1 *)&data->next = 1;
        conn_local._4_4_ = CURLE_OK;
      }
    }
    else {
      conn_local._4_4_ = CURLE_URL_MALFORMAT;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode file_connect(struct connectdata *conn, bool *done)
{
  struct SessionHandle *data = conn->data;
  char *real_path;
  struct FILEPROTO *file = data->req.protop;
  int fd;
#ifdef DOS_FILESYSTEM
  int i;
  char *actual_path;
#endif
  int real_path_len;

  real_path = curl_easy_unescape(data, data->state.path, 0, &real_path_len);
  if(!real_path)
    return CURLE_OUT_OF_MEMORY;

#ifdef DOS_FILESYSTEM
  /* If the first character is a slash, and there's
     something that looks like a drive at the beginning of
     the path, skip the slash.  If we remove the initial
     slash in all cases, paths without drive letters end up
     relative to the current directory which isn't how
     browsers work.

     Some browsers accept | instead of : as the drive letter
     separator, so we do too.

     On other platforms, we need the slash to indicate an
     absolute pathname.  On Windows, absolute paths start
     with a drive letter.
  */
  actual_path = real_path;
  if((actual_path[0] == '/') &&
      actual_path[1] &&
     (actual_path[2] == ':' || actual_path[2] == '|')) {
    actual_path[2] = ':';
    actual_path++;
    real_path_len--;
  }

  /* change path separators from '/' to '\\' for DOS, Windows and OS/2 */
  for(i=0; i < real_path_len; ++i)
    if(actual_path[i] == '/')
      actual_path[i] = '\\';
    else if(!actual_path[i]) /* binary zero */
      return CURLE_URL_MALFORMAT;

  fd = open_readonly(actual_path, O_RDONLY|O_BINARY);
  file->path = actual_path;
#else
  if(memchr(real_path, 0, real_path_len))
    /* binary zeroes indicate foul play */
    return CURLE_URL_MALFORMAT;

  fd = open_readonly(real_path, O_RDONLY);
  file->path = real_path;
#endif
  file->freepath = real_path; /* free this when done */

  file->fd = fd;
  if(!data->set.upload && (fd == -1)) {
    failf(data, "Couldn't open file %s", data->state.path);
    file_done(conn, CURLE_FILE_COULDNT_READ_FILE, FALSE);
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  *done = TRUE;

  return CURLE_OK;
}